

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_new_glyph(FT_Library library,FT_Glyph_Class *clazz,FT_Glyph *aglyph)

{
  undefined8 *puVar1;
  FT_Glyph glyph;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory;
  FT_Glyph *aglyph_local;
  FT_Glyph_Class *clazz_local;
  FT_Library library_local;
  
  pFStack_28 = library->memory;
  *aglyph = (FT_Glyph)0x0;
  memory = (FT_Memory)aglyph;
  aglyph_local = (FT_Glyph *)clazz;
  clazz_local = (FT_Glyph_Class *)library;
  puVar1 = (undefined8 *)ft_mem_alloc(pFStack_28,clazz->glyph_size,(FT_Error *)((long)&glyph + 4));
  if (glyph._4_4_ == 0) {
    *puVar1 = clazz_local;
    puVar1[1] = aglyph_local;
    *(undefined4 *)(puVar1 + 2) = *(undefined4 *)(aglyph_local + 1);
    memory->user = puVar1;
  }
  return glyph._4_4_;
}

Assistant:

static FT_Error
   ft_new_glyph( FT_Library             library,
                 const FT_Glyph_Class*  clazz,
                 FT_Glyph*              aglyph )
   {
     FT_Memory  memory = library->memory;
     FT_Error   error;
     FT_Glyph   glyph  = NULL;


     *aglyph = NULL;

     if ( !FT_ALLOC( glyph, clazz->glyph_size ) )
     {
       glyph->library = library;
       glyph->clazz   = clazz;
       glyph->format  = clazz->glyph_format;

       *aglyph = glyph;
     }

     return error;
   }